

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::CloseFileStreams(cmMakefileTargetGenerator *this)

{
  cmGeneratedFileStream *pcVar1;
  
  pcVar1 = (this->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->BuildFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
  }
  pcVar1 = (this->InfoFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->InfoFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
  }
  pcVar1 = (this->FlagFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->FlagFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
    return;
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CloseFileStreams()
{
  this->BuildFileStream.reset();
  this->InfoFileStream.reset();
  this->FlagFileStream.reset();
}